

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntEqual(Vec_Int_t *p1,Vec_Int_t *p2)

{
  int local_24;
  int i;
  Vec_Int_t *p2_local;
  Vec_Int_t *p1_local;
  
  if (p1->nSize == p2->nSize) {
    for (local_24 = 0; local_24 < p1->nSize; local_24 = local_24 + 1) {
      if (p1->pArray[local_24] != p2->pArray[local_24]) {
        return 0;
      }
    }
    p1_local._4_4_ = 1;
  }
  else {
    p1_local._4_4_ = 0;
  }
  return p1_local._4_4_;
}

Assistant:

static inline int Vec_IntEqual( Vec_Int_t * p1, Vec_Int_t * p2 ) 
{
    int i;
    if ( p1->nSize != p2->nSize )
        return 0;
    for ( i = 0; i < p1->nSize; i++ )
        if ( p1->pArray[i] != p2->pArray[i] )
            return 0;
    return 1;
}